

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

void __thiscall
capnp::_::(anonymous_namespace)::TestNoTailForwarder::dispatchCall(TestNoTailForwarder *this)

{
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> in_RCX;
  uint16_t in_DX;
  long *in_RSI;
  
  anon_unknown_0::TestNoTailForwarder::dispatchCall
            ((TestNoTailForwarder *)this,(long)in_RSI + *(long *)(*in_RSI + -0x18),in_DX,in_RCX);
  return;
}

Assistant:

DispatchCallResult dispatchCall(uint64_t interfaceId, uint16_t methodId,
                                  CallContext<AnyPointer, AnyPointer> context) override {
    if (interfaceId == capnp::typeId<test::TestMoreStuff>() && methodId == 3) {
      // Calling TestMoreStuff.hold(). Dispatch normally.
      return test::TestMoreStuff::Server::dispatchCall(interfaceId, methodId, context);
    }

    auto params = context.getParams();
    auto req = next.typelessRequest(interfaceId, methodId, params.targetSize(), {});
    req.set(params);
    auto promise = req.send().then([context](Response<AnyPointer> resp) mutable {
      context.getResults(resp.targetSize()).set(resp);
    });
    return { .promise = kj::mv(promise), .isStreaming = false };
  }